

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

Float __thiscall
pbrt::PiecewiseLinearSpectrum::operator()(PiecewiseLinearSpectrum *this,Float lambda)

{
  size_t sVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  
  sVar1 = (this->lambdas).nStored;
  if (((sVar1 != 0) && (pfVar2 = (this->lambdas).ptr, *pfVar2 <= lambda)) &&
     (lambda <= pfVar2[sVar1 - 1])) {
    uVar5 = sVar1 - 2;
    lVar6 = 1;
    uVar7 = uVar5;
    while (uVar4 = uVar7, 0 < (long)uVar4) {
      uVar7 = uVar4 >> 1;
      if (pfVar2[(int)uVar7 + (int)lVar6] <= lambda) {
        lVar6 = uVar7 + 1 + lVar6;
        uVar7 = ~uVar7 + uVar4;
      }
    }
    if (lVar6 - 1U < uVar5) {
      uVar5 = lVar6 - 1U;
    }
    lVar8 = 0;
    if (0 < lVar6) {
      lVar8 = uVar5 << 0x20;
    }
    fVar9 = *(float *)((long)pfVar2 + (lVar8 >> 0x1e));
    lVar6 = lVar8 + 0x100000000 >> 0x1e;
    fVar9 = (lambda - fVar9) / (*(float *)((long)pfVar2 + lVar6) - fVar9);
    pfVar2 = (this->values).ptr;
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * *(float *)((long)pfVar2 + lVar6))),
                             ZEXT416((uint)(1.0 - fVar9)),
                             ZEXT416(*(uint *)((long)pfVar2 + (lVar8 >> 0x1e))));
    return auVar3._0_4_;
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
    size_t size() const { return nStored; }